

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDComponentPtr::CompareType(ON_SubDComponentPtr *a,ON_SubDComponentPtr *b)

{
  sbyte sVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  uVar3 = 0;
  if (a != b) {
    if (a == (ON_SubDComponentPtr *)0x0) {
      return 1;
    }
    if (b == (ON_SubDComponentPtr *)0x0) {
      return -1;
    }
    uVar2 = (uint)a->m_ptr & 6;
    uVar3 = (uint)b->m_ptr & 6;
    sVar1 = (sbyte)uVar3;
    bVar5 = 0x2e >> sVar1;
    bVar6 = (byte)(0x6020402020200 >> (sbyte)(uVar2 << 3));
    bVar4 = (byte)(0x6020402020200 >> (sbyte)(uVar3 << 3));
    uVar3 = 0;
    if (bVar6 != bVar4) {
      uVar3 = 0xffffffff;
      switch(uVar2) {
      case 0:
        uVar3 = -(uint)(bVar6 < bVar4);
        break;
      case 2:
        goto switchD_005d0c13_caseD_2;
      case 6:
        bVar5 = bVar5 | 0x10U >> sVar1;
      case 4:
        uVar3 = (bVar5 & 1) - 1;
      }
      uVar3 = uVar3 | 1;
    }
  }
switchD_005d0c13_caseD_2:
  return uVar3;
}

Assistant:

int ON_SubDComponentPtr::CompareType(
  const ON_SubDComponentPtr* a,
  const ON_SubDComponentPtr* b
  )
{
  if ( a == b )
    return 0;
    // sort nullptrs to ends of arrays
  if ( nullptr == a )
    return 1; // nonzero b < nullptr a
  if ( nullptr == b )
    return -1; // nonzero a < nullptr b
  return ON_SubDComponentPtr::CompareComponentPtrType(a->ComponentType(), b->ComponentType());
}